

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

KeyValue<supermap::Key<128UL>,_unsigned_long> * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::get(KeyValue<supermap::Key<128UL>,_unsigned_long> *__return_storage_ptr__,
     SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
     *this,unsigned_long index)

{
  pointer *__ptr;
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
  local_98;
  tuple<supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_> local_88;
  undefined1 local_80 [56];
  string local_48;
  
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
                  *)local_80);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_48,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
              *)this);
  std::filesystem::__cxx11::path::path((path *)(local_80 + 0x10),&local_48,auto_format);
  (**(code **)*(_func_int **)local_80._0_8_)(&local_88,local_80._0_8_,local_80 + 0x10,index * 0x88);
  local_98.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )local_88.
           super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
           .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl;
  local_98.index_ = 0;
  io::
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
  ::next(__return_storage_ptr__,&local_98);
  if ((_Head_base<0UL,_supermap::io::InputStream_*,_false>)
      local_98.input_._M_t.
      super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
      .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl !=
      (_Head_base<0UL,_supermap::io::InputStream_*,_false>)0x0) {
    (**(code **)(*(long *)local_98.input_._M_t.
                          super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
                          .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl +
                0x18))();
  }
  local_98.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
          )0x0;
  std::filesystem::__cxx11::path::~path((path *)(local_80 + 0x10));
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }